

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

GLuint __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareProgram
          (FunctionalTest *this,GLenum target,TextureInternalFormatDescriptor descriptor,
          ColorChannelSelector channel)

{
  undefined *puVar1;
  TextureInternalFormatDescriptor descriptor_00;
  undefined8 gl_00;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  string *psVar7;
  TestContext *this_00;
  TestLog *log;
  GLchar *fragment_shader_source;
  GLint i;
  GLint i_00;
  undefined1 local_528 [4];
  GLuint program;
  allocator<char> local_501;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  allocator<char> local_369;
  string local_368;
  string local_348;
  string local_328;
  allocator<char> local_301;
  string local_300 [8];
  string fragment_shader;
  string local_2d8 [8];
  string template_verison;
  allocator<char> local_131;
  string local_130 [8];
  string sampler_prefix;
  string local_108 [8];
  string type_name;
  string local_e0 [8];
  string component_name;
  string local_a0;
  allocator<char> local_79;
  string local_78 [8];
  string texel_fetch_arguments_tail;
  allocator<char> local_41;
  string local_40 [8];
  string sampler_name;
  Functions *gl;
  ColorChannelSelector channel_local;
  GLenum target_local;
  FunctionalTest *this_local;
  
  descriptor_00 = descriptor;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  sampler_name.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"",&local_79);
  std::allocator<char>::~allocator(&local_79);
  if (target == 0xde0) {
    std::__cxx11::string::operator=(local_40,"sampler1D");
    std::__cxx11::string::operator=(local_78,"0, 0");
  }
  else if (target == 0xde1) {
    std::__cxx11::string::operator=(local_40,"sampler2D");
    std::__cxx11::string::operator=(local_78,"ivec2(0), 0");
  }
  else if (target == 0x806f) {
    std::__cxx11::string::operator=(local_40,"sampler3D");
    std::__cxx11::string::operator=(local_78,"ivec3(0), 0");
  }
  else if (target == 0x84f5) {
    std::__cxx11::string::operator=(local_40,"sampler2DRect");
    std::__cxx11::string::operator=(local_78,"ivec2(0)");
  }
  else if (target == 0x8c18) {
    std::__cxx11::string::operator=(local_40,"sampler1DArray");
    std::__cxx11::string::operator=(local_78,"ivec2(0), 0");
  }
  else if (target == 0x8c1a) {
    std::__cxx11::string::operator=(local_40,"sampler2DArray");
    std::__cxx11::string::operator=(local_78,"ivec3(0), 0");
  }
  else if (target == 0x9100) {
    std::__cxx11::string::operator=(local_40,"sampler2DMS");
    std::__cxx11::string::operator=(local_78,"ivec2(0), ");
    Utilities::itoa_abi_cxx11_(&local_a0,(Utilities *)(ulong)(this->m_max_samples - 1),i);
    std::__cxx11::string::append(local_78);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    if (target != 0x9102) {
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0;
      __cxa_throw(puVar6,&int::typeinfo,0);
    }
    std::__cxx11::string::operator=(local_40,"sampler2DMSArray");
    std::__cxx11::string::operator=(local_78,"ivec3(0), ");
    Utilities::itoa_abi_cxx11_
              ((string *)((long)&component_name.field_2 + 8),
               (Utilities *)(ulong)(this->m_max_samples - 1),i_00);
    std::__cxx11::string::append(local_78);
    std::__cxx11::string::~string((string *)(component_name.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e0,"",(allocator<char> *)(type_name.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(type_name.field_2._M_local_buf + 0xf));
  switch(channel) {
  case RED_COMPONENT:
    std::__cxx11::string::operator=(local_e0,".r");
    break;
  case GREEN_COMPONENT:
    std::__cxx11::string::operator=(local_e0,".g");
    break;
  case BLUE_COMPONENT:
    std::__cxx11::string::operator=(local_e0,".b");
    break;
  case ALPHA_COMPONENT:
    std::__cxx11::string::operator=(local_e0,".a");
    break;
  case COMPONENTS_COUNT:
    break;
  default:
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"",(allocator<char> *)(sampler_prefix.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(sampler_prefix.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"",&local_131);
  std::allocator<char>::~allocator(&local_131);
  bVar2 = isFloatType(this,descriptor);
  if ((((bVar2) || (bVar2 = isFixedSignedType(this,descriptor), bVar2)) ||
      (bVar2 = isFixedUnsignedType(this,descriptor), bVar2)) ||
     ((bVar2 = isDepthType(this,descriptor), bVar2 ||
      (bVar2 = isStencilType(this,descriptor), bVar2)))) {
    if (channel == COMPONENTS_COUNT) {
      std::__cxx11::string::operator=(local_108,"vec4");
    }
    else {
      std::__cxx11::string::operator=(local_108,"float");
    }
    std::__cxx11::string::operator=(local_130,"");
  }
  else {
    template_verison.field_2._8_4_ = descriptor.required_by_context.super_ApiType.m_bits;
    template_verison.field_2._12_4_ = descriptor.internal_format;
    bVar2 = isIntegerSignedType(this,descriptor_00);
    if (bVar2) {
      if (channel == COMPONENTS_COUNT) {
        std::__cxx11::string::operator=(local_108,"ivec4");
      }
      else {
        std::__cxx11::string::operator=(local_108,"int");
      }
      std::__cxx11::string::operator=(local_130,"i");
    }
    else {
      if (channel == COMPONENTS_COUNT) {
        std::__cxx11::string::operator=(local_108,"uvec4");
      }
      else {
        std::__cxx11::string::operator=(local_108,"uint");
      }
      std::__cxx11::string::operator=(local_130,"u");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,"#version 150",
             (allocator<char> *)(fragment_shader.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fragment_shader.field_2._M_local_buf + 0xf));
  puVar1 = s_fragment_shader_template;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_300,puVar1,&local_301);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::string((string *)&local_348,local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"TEMPLATE_TYPE",&local_369);
  std::__cxx11::string::string((string *)&local_390,local_108);
  Utilities::preprocessString(&local_328,&local_348,&local_368,&local_390);
  std::__cxx11::string::operator=(local_300,(string *)&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string((string *)&local_3d0,local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"TEMPLATE_SAMPLER",&local_3f1);
  psVar7 = (string *)std::__cxx11::string::append(local_130);
  std::__cxx11::string::string((string *)&local_418,psVar7);
  Utilities::preprocessString(&local_3b0,&local_3d0,&local_3f0,&local_418);
  std::__cxx11::string::operator=(local_300,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::string((string *)&local_458,local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"TEMPLATE_TEXEL_FETCH_ARGUMENTS",&local_479);
  std::__cxx11::string::string((string *)&local_4a0,local_78);
  Utilities::preprocessString(&local_438,&local_458,&local_478,&local_4a0);
  std::__cxx11::string::operator=(local_300,(string *)&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::string((string *)&local_4e0,local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"TEMPLATE_COMPONENT",&local_501);
  std::__cxx11::string::string((string *)local_528,local_e0);
  Utilities::preprocessString(&local_4c0,&local_4e0,&local_500,(string *)local_528);
  std::__cxx11::string::operator=(local_300,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4e0);
  gl_00 = sampler_name.field_2._8_8_;
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  log = tcu::TestContext::getLog(this_00);
  puVar1 = s_vertex_shader_code;
  fragment_shader_source = (GLchar *)std::__cxx11::string::c_str();
  GVar4 = Utilities::buildProgram((Functions *)gl_00,log,puVar1,fragment_shader_source);
  if (GVar4 != 0) {
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2d8);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
    return GVar4;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

glw::GLuint FunctionalTest::prepareProgram(glw::GLenum target, TextureInternalFormatDescriptor descriptor,
										   ColorChannelSelector channel)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing sampler name and textelFetch arguments */
	std::string sampler_name			   = "";
	std::string texel_fetch_arguments_tail = "";

	switch (target)
	{
	case GL_TEXTURE_1D:
		sampler_name			   = "sampler1D";
		texel_fetch_arguments_tail = "0, 0";
		break;
	case GL_TEXTURE_2D:
		sampler_name			   = "sampler2D";
		texel_fetch_arguments_tail = "ivec2(0), 0";
		break;
	case GL_TEXTURE_1D_ARRAY:
		sampler_name			   = "sampler1DArray";
		texel_fetch_arguments_tail = "ivec2(0), 0";
		break;
	case GL_TEXTURE_RECTANGLE:
		sampler_name			   = "sampler2DRect";
		texel_fetch_arguments_tail = "ivec2(0)";
		break;
	case GL_TEXTURE_2D_ARRAY:
		sampler_name			   = "sampler2DArray";
		texel_fetch_arguments_tail = "ivec3(0), 0";
		break;
	case GL_TEXTURE_3D:
		sampler_name			   = "sampler3D";
		texel_fetch_arguments_tail = "ivec3(0), 0";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		sampler_name			   = "sampler2DMS";
		texel_fetch_arguments_tail = "ivec2(0), ";
		texel_fetch_arguments_tail.append(Utilities::itoa(m_max_samples - 1));
		break;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		sampler_name			   = "sampler2DMSArray";
		texel_fetch_arguments_tail = "ivec3(0), ";
		texel_fetch_arguments_tail.append(Utilities::itoa(m_max_samples - 1));
		break;
	default:
		throw 0;
	}

	/* Preparing component selector name */
	std::string component_name = "";

	switch (channel)
	{
	case RED_COMPONENT:
		component_name = ".r";
		break;
	case GREEN_COMPONENT:
		component_name = ".g";
		break;
	case BLUE_COMPONENT:
		component_name = ".b";
		break;
	case ALPHA_COMPONENT:
		component_name = ".a";
		break;
	case COMPONENTS_COUNT:
		break;
	default:
		throw 0;
	}

	/* Preparing output type name and sampler prefix */
	std::string type_name	  = "";
	std::string sampler_prefix = "";

	if (isFloatType(descriptor) || isFixedSignedType(descriptor) || isFixedUnsignedType(descriptor) ||
		isDepthType(descriptor) || isStencilType(descriptor))
	{
		if (channel == COMPONENTS_COUNT)
		{
			type_name = "vec4";
		}
		else
		{
			type_name = "float";
		}
		sampler_prefix = "";
	}
	else
	{
		if (isIntegerSignedType(descriptor))
		{
			if (channel == COMPONENTS_COUNT)
			{
				type_name = "ivec4";
			}
			else
			{
				type_name = "int";
			}
			sampler_prefix = "i";
		}
		else
		{
			if (channel == COMPONENTS_COUNT)
			{
				type_name = "uvec4";
			}
			else
			{
				type_name = "uint";
			}
			sampler_prefix = "u";
		}
	}

	std::string template_verison = "#version 150";

	/* Preprocessing fragment shader source code. */
	std::string fragment_shader = s_fragment_shader_template;

	fragment_shader = Utilities::preprocessString(fragment_shader, "TEMPLATE_TYPE", type_name);
	fragment_shader =
		Utilities::preprocessString(fragment_shader, "TEMPLATE_SAMPLER", sampler_prefix.append(sampler_name));
	fragment_shader =
		Utilities::preprocessString(fragment_shader, "TEMPLATE_TEXEL_FETCH_ARGUMENTS", texel_fetch_arguments_tail);
	fragment_shader = Utilities::preprocessString(fragment_shader, "TEMPLATE_COMPONENT", component_name);

	/* Building program. */
	glw::GLuint program =
		Utilities::buildProgram(gl, m_context.getTestContext().getLog(), s_vertex_shader_code, fragment_shader.c_str());

	if (0 == program)
	{
		throw 0;
	}

	/* Return program name. */
	return program;
}